

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_write(Curl_easy *data,int type,char *buf,size_t blen)

{
  char *pcVar1;
  curl_off_t *pcVar2;
  undefined1 *puVar3;
  byte bVar4;
  CURLcode CVar5;
  short *psVar6;
  Curl_cwriter *pCVar7;
  short *psVar8;
  
  if (((((type & 1U) != 0) && ((data->conn->handler->protocol & 0xc) != 0)) &&
      ((data->conn->proto).ftpc.transfertype == 'A')) && (blen != 0 && buf != (char *)0x0)) {
    bVar4 = (data->state).field_0x558;
    if ((bVar4 & 1) != 0) {
      if (*buf == '\n') {
        blen = blen - 1;
        memmove(buf,buf + 1,blen);
        pcVar2 = &(data->state).crlf_conversions;
        *pcVar2 = *pcVar2 + 1;
        bVar4 = (data->state).field_0x558;
      }
      (data->state).field_0x558 = bVar4 & 0xfe;
    }
    psVar6 = (short *)memchr(buf,0xd,blen);
    if (psVar6 != (short *)0x0) {
      psVar8 = psVar6;
      for (; psVar6 < buf + (blen - 1); psVar6 = (short *)((long)psVar6 + 1)) {
        if (*psVar6 == 0xa0d) {
          pcVar1 = (char *)((long)psVar6 + 1);
          psVar6 = (short *)((long)psVar6 + 1);
          *(char *)psVar8 = *pcVar1;
          pcVar2 = &(data->state).crlf_conversions;
          *pcVar2 = *pcVar2 + 1;
        }
        else if ((char)*psVar6 == '\r') {
          *(char *)psVar8 = '\n';
        }
        else {
          *(char *)psVar8 = (char)*psVar6;
        }
        psVar8 = (short *)((long)psVar8 + 1);
      }
      if (psVar6 < buf + blen) {
        if ((char)*psVar6 == '\r') {
          *(char *)psVar8 = '\n';
          puVar3 = &(data->state).field_0x558;
          *puVar3 = *puVar3 | 1;
        }
        else {
          *(char *)psVar8 = (char)*psVar6;
        }
        psVar8 = (short *)((long)psVar8 + 1);
      }
      if (psVar8 < buf + blen) {
        *(char *)psVar8 = '\0';
      }
      blen = (long)psVar8 - (long)buf;
    }
  }
  pCVar7 = (data->req).writer_stack;
  if (pCVar7 != (Curl_cwriter *)0x0) {
LAB_005aa2fb:
    CVar5 = (*pCVar7->cwt->do_write)(data,pCVar7,type,buf,blen);
    return CVar5;
  }
  CVar5 = do_init_stack(data);
  if (CVar5 == CURLE_OK) {
    pCVar7 = (data->req).writer_stack;
    if (pCVar7 != (Curl_cwriter *)0x0) goto LAB_005aa2fb;
    CVar5 = CURLE_WRITE_ERROR;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type, char *buf, size_t blen)
{
  CURLcode result;

#if !defined(CURL_DISABLE_FTP) && defined(CURL_DO_LINEEND_CONV)
  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
     (data->conn->handler->protocol & PROTO_FAMILY_FTP) &&
     data->conn->proto.ftpc.transfertype == 'A') {
    /* convert end-of-line markers */
    blen = convert_lineends(data, buf, blen);
  }
#endif
  /* it is one of those, at least */
  DEBUGASSERT(type & (CLIENTWRITE_BODY|CLIENTWRITE_HEADER|CLIENTWRITE_INFO));
  /* BODY is only BODY (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_BODY) ||
              ((type & ~(CLIENTWRITE_BODY|CLIENTWRITE_EOS)) == 0));
  /* INFO is only INFO (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_INFO) ||
              ((type & ~(CLIENTWRITE_INFO|CLIENTWRITE_EOS)) == 0));

  if(!data->req.writer_stack) {
    result = do_init_stack(data);
    if(result)
      return result;
    DEBUGASSERT(data->req.writer_stack);
  }

  return Curl_cwriter_write(data, data->req.writer_stack, type, buf, blen);
}